

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

void init_scoring(int n_row,int n_col,Colamd_Row *Row,Colamd_Col *Col,int *A,int *head,double *knobs
                 ,int *p_n_row2,int *p_n_col2,int *p_max_deg)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  double dVar5;
  double dVar6;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  double local_b8;
  int local_ac;
  double local_98;
  int local_80;
  int next_col;
  int max_deg;
  int min_score;
  int dense_col_count;
  int dense_row_count;
  int n_row2;
  int n_col2;
  int score;
  int col_length;
  int *new_cp;
  int *cp_end;
  int *piStack_48;
  int deg;
  int *cp;
  int local_38;
  int row;
  int r;
  int c;
  int *head_local;
  int *A_local;
  Colamd_Col *Col_local;
  Colamd_Row *Row_local;
  int n_col_local;
  int n_row_local;
  
  if (0.0 < *knobs || *knobs == 0.0) {
    dVar6 = *knobs;
    dVar5 = sqrt((double)n_col);
    if (16.0 <= dVar6 * dVar5) {
      local_98 = *knobs;
      dVar6 = sqrt((double)n_col);
      local_98 = local_98 * dVar6;
    }
    else {
      local_98 = 16.0;
    }
    min_score = (int)local_98;
  }
  else {
    min_score = n_col + -1;
  }
  if (0.0 < knobs[1] || knobs[1] == 0.0) {
    dVar6 = knobs[1];
    local_ac = n_col;
    if (n_row < n_col) {
      local_ac = n_row;
    }
    dVar5 = sqrt((double)local_ac);
    if (16.0 <= dVar6 * dVar5) {
      local_b8 = knobs[1];
      local_c4 = n_col;
      if (n_row < n_col) {
        local_c4 = n_row;
      }
      dVar6 = sqrt((double)local_c4);
      local_b8 = local_b8 * dVar6;
    }
    else {
      local_b8 = 16.0;
    }
    max_deg = (int)local_b8;
  }
  else {
    max_deg = n_row + -1;
  }
  local_80 = 0;
  dense_row_count = n_col;
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (Col[row].length == 0) {
      dense_row_count = dense_row_count + -1;
      Col[row].shared2.score = dense_row_count;
      Col[row].start = -1;
    }
  }
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if ((-1 < Col[row].start) && (max_deg < Col[row].length)) {
      dense_row_count = dense_row_count + -1;
      Col[row].shared2.score = dense_row_count;
      iVar2 = Col[row].start;
      iVar1 = Col[row].length;
      piStack_48 = A + iVar2;
      while (piStack_48 < A + iVar2 + iVar1) {
        Row[*piStack_48].shared1.degree = Row[*piStack_48].shared1.degree + -1;
        piStack_48 = piStack_48 + 1;
      }
      Col[row].start = -1;
    }
  }
  dense_col_count = n_row;
  for (local_38 = 0; local_38 < n_row; local_38 = local_38 + 1) {
    local_c8 = Row[local_38].shared1.degree;
    if ((min_score < local_c8) || (local_c8 == 0)) {
      Row[local_38].shared2.mark = -1;
      dense_col_count = dense_col_count + -1;
    }
    else {
      if (local_c8 < local_80) {
        local_c8 = local_80;
      }
      local_80 = local_c8;
    }
  }
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (-1 < Col[row].start) {
      n_row2 = 0;
      piVar3 = A + Col[row].start;
      iVar2 = Col[row].length;
      _score = piVar3;
      piStack_48 = piVar3;
      while (piStack_48 < piVar3 + iVar2) {
        piVar4 = piStack_48 + 1;
        iVar1 = *piStack_48;
        piStack_48 = piVar4;
        if (-1 < Row[iVar1].shared2.mark) {
          *_score = iVar1;
          iVar1 = Row[iVar1].shared1.degree + -1 + n_row2;
          local_cc = n_col;
          if (iVar1 < n_col) {
            local_cc = iVar1;
          }
          n_row2 = local_cc;
          _score = _score + 1;
        }
      }
      iVar2 = (int)((long)_score - (long)(A + Col[row].start) >> 2);
      if (iVar2 == 0) {
        dense_row_count = dense_row_count + -1;
        Col[row].shared2.score = dense_row_count;
        Col[row].start = -1;
      }
      else {
        Col[row].length = iVar2;
        Col[row].shared2.score = n_row2;
      }
    }
  }
  for (row = 0; row <= n_col; row = row + 1) {
    head[row] = -1;
  }
  next_col = n_col;
  for (row = n_col + -1; -1 < row; row = row + -1) {
    if (-1 < Col[row].start) {
      local_d0 = Col[row].shared2.score;
      iVar2 = head[local_d0];
      Col[row].shared3.headhash = -1;
      Col[row].shared4.degree_next = iVar2;
      if (iVar2 != -1) {
        Col[iVar2].shared3.headhash = row;
      }
      head[local_d0] = row;
      if (next_col < local_d0) {
        local_d0 = next_col;
      }
      next_col = local_d0;
    }
  }
  *p_n_col2 = dense_row_count;
  *p_n_row2 = dense_col_count;
  *p_max_deg = local_80;
  return;
}

Assistant:

PRIVATE void init_scoring
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows of A */
    Int n_col,			/* number of columns of A */
    Colamd_Row Row [],		/* of size n_row+1 */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int A [],			/* column form and row form of A */
    Int head [],		/* of size n_col+1 */
    double knobs [COLAMD_KNOBS],/* parameters */
    Int *p_n_row2,		/* number of non-dense, non-empty rows */
    Int *p_n_col2,		/* number of non-dense, non-empty columns */
    Int *p_max_deg		/* maximum row degree */
)
{
    /* === Local variables ================================================== */

    Int c ;			/* a column index */
    Int r, row ;		/* a row index */
    Int *cp ;			/* a column pointer */
    Int deg ;			/* degree of a row or column */
    Int *cp_end ;		/* a pointer to the end of a column */
    Int *new_cp ;		/* new column pointer */
    Int col_length ;		/* length of pruned column */
    Int score ;			/* current column score */
    Int n_col2 ;		/* number of non-dense, non-empty columns */
    Int n_row2 ;		/* number of non-dense, non-empty rows */
    Int dense_row_count ;	/* remove rows with more entries than this */
    Int dense_col_count ;	/* remove cols with more entries than this */
    Int min_score ;		/* smallest column score */
    Int max_deg ;		/* maximum row degree */
    Int next_col ;		/* Used to add to degree list.*/

#ifndef NDEBUG
    Int debug_count ;		/* debug only. */
#endif /* NDEBUG */

    /* === Extract knobs ==================================================== */

    /* Note: if knobs contains a NaN, this is undefined: */
    if (knobs [COLAMD_DENSE_ROW] < 0)
    {
	/* only remove completely dense rows */
	dense_row_count = n_col-1 ;
    }
    else
    {
	dense_row_count = DENSE_DEGREE (knobs [COLAMD_DENSE_ROW], n_col) ;
    }
    if (knobs [COLAMD_DENSE_COL] < 0)
    {
	/* only remove completely dense columns */
	dense_col_count = n_row-1 ;
    }
    else
    {
	dense_col_count =
	    DENSE_DEGREE (knobs [COLAMD_DENSE_COL], MIN (n_row, n_col)) ;
    }

    DEBUG1 (("colamd: densecount: %d %d\n", dense_row_count, dense_col_count)) ;
    max_deg = 0 ;
    n_col2 = n_col ;
    n_row2 = n_row ;

    /* === Kill empty columns =============================================== */

    /* Put the empty columns at the end in their natural order, so that LU */
    /* factorization can proceed as far as possible. */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	deg = Col [c].length ;
	if (deg == 0)
	{
	    /* this is a empty column, kill and order it last */
	    Col [c].shared2.order = --n_col2 ;
	    KILL_PRINCIPAL_COL (c) ;
	}
    }
    DEBUG1 (("colamd: null columns killed: %d\n", n_col - n_col2)) ;

    /* === Kill dense columns =============================================== */

    /* Put the dense columns at the end, in their natural order */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* skip any dead columns */
	if (COL_IS_DEAD (c))
	{
	    continue ;
	}
	deg = Col [c].length ;
	if (deg > dense_col_count)
	{
	    /* this is a dense column, kill and order it last */
	    Col [c].shared2.order = --n_col2 ;
	    /* decrement the row degrees */
	    cp = &A [Col [c].start] ;
	    cp_end = cp + Col [c].length ;
	    while (cp < cp_end)
	    {
		Row [*cp++].shared1.degree-- ;
	    }
	    KILL_PRINCIPAL_COL (c) ;
	}
    }
    DEBUG1 (("colamd: Dense and null columns killed: %d\n", n_col - n_col2)) ;

    /* === Kill dense and empty rows ======================================== */

    for (r = 0 ; r < n_row ; r++)
    {
	deg = Row [r].shared1.degree ;
	ASSERT (deg >= 0 && deg <= n_col) ;
	if (deg > dense_row_count || deg == 0)
	{
	    /* kill a dense or empty row */
	    KILL_ROW (r) ;
	    --n_row2 ;
	}
	else
	{
	    /* keep track of max degree of remaining rows */
	    max_deg = MAX (max_deg, deg) ;
	}
    }
    DEBUG1 (("colamd: Dense and null rows killed: %d\n", n_row - n_row2)) ;

    /* === Compute initial column scores ==================================== */

    /* At this point the row degrees are accurate.  They reflect the number */
    /* of "live" (non-dense) columns in each row.  No empty rows exist. */
    /* Some "live" columns may contain only dead rows, however.  These are */
    /* pruned in the code below. */

    /* now find the initial matlab score for each column */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* skip dead column */
	if (COL_IS_DEAD (c))
	{
	    continue ;
	}
	score = 0 ;
	cp = &A [Col [c].start] ;
	new_cp = cp ;
	cp_end = cp + Col [c].length ;
	while (cp < cp_end)
	{
	    /* get a row */
	    row = *cp++ ;
	    /* skip if dead */
	    if (ROW_IS_DEAD (row))
	    {
		continue ;
	    }
	    /* compact the column */
	    *new_cp++ = row ;
	    /* add row's external degree */
	    score += Row [row].shared1.degree - 1 ;
	    /* guard against integer overflow */
	    score = MIN (score, n_col) ;
	}
	/* determine pruned column length */
	col_length = (Int) (new_cp - &A [Col [c].start]) ;
	if (col_length == 0)
	{
	    /* a newly-made null column (all rows in this col are "dense" */
	    /* and have already been killed) */
	    DEBUG2 (("Newly null killed: %d\n", c)) ;
	    Col [c].shared2.order = --n_col2 ;
	    KILL_PRINCIPAL_COL (c) ;
	}
	else
	{
	    /* set column length and set score */
	    ASSERT (score >= 0) ;
	    ASSERT (score <= n_col) ;
	    Col [c].length = col_length ;
	    Col [c].shared2.score = score ;
	}
    }
    DEBUG1 (("colamd: Dense, null, and newly-null columns killed: %d\n",
    	n_col-n_col2)) ;

    /* At this point, all empty rows and columns are dead.  All live columns */
    /* are "clean" (containing no dead rows) and simplicial (no supercolumns */
    /* yet).  Rows may contain dead columns, but all live rows contain at */
    /* least one live column. */

#ifndef NDEBUG
    debug_structures (n_row, n_col, Row, Col, A, n_col2) ;
#endif /* NDEBUG */

    /* === Initialize degree lists ========================================== */

#ifndef NDEBUG
    debug_count = 0 ;
#endif /* NDEBUG */

    /* clear the hash buckets */
    for (c = 0 ; c <= n_col ; c++)
    {
	head [c] = COLAMD_EMPTY ;
    }
    min_score = n_col ;
    /* place in reverse order, so low column indices are at the front */
    /* of the lists.  This is to encourage natural tie-breaking */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* only add principal columns to degree lists */
	if (COL_IS_ALIVE (c))
	{
	    DEBUG4 (("place %d score %d minscore %d ncol %d\n",
		c, Col [c].shared2.score, min_score, n_col)) ;

	    /* === Add columns score to DList =============================== */

	    score = Col [c].shared2.score ;

	    ASSERT (min_score >= 0) ;
	    ASSERT (min_score <= n_col) ;
	    ASSERT (score >= 0) ;
	    ASSERT (score <= n_col) ;
	    ASSERT (head [score] >= COLAMD_EMPTY) ;

	    /* now add this column to dList at proper score location */
	    next_col = head [score] ;
	    Col [c].shared3.prev = COLAMD_EMPTY ;
	    Col [c].shared4.degree_next = next_col ;

	    /* if there already was a column with the same score, set its */
	    /* previous pointer to this new column */
	    if (next_col != COLAMD_EMPTY)
	    {
		Col [next_col].shared3.prev = c ;
	    }
	    head [score] = c ;

	    /* see if this score is less than current min */
	    min_score = MIN (min_score, score) ;

#ifndef NDEBUG
	    debug_count++ ;
#endif /* NDEBUG */

	}
    }

#ifndef NDEBUG
    DEBUG1 (("colamd: Live cols %d out of %d, non-princ: %d\n",
	debug_count, n_col, n_col-debug_count)) ;
    ASSERT (debug_count == n_col2) ;
    debug_deg_lists (n_row, n_col, Row, Col, head, min_score, n_col2, max_deg) ;
#endif /* NDEBUG */

    /* === Return number of remaining columns, and max row degree =========== */

    *p_n_col2 = n_col2 ;
    *p_n_row2 = n_row2 ;
    *p_max_deg = max_deg ;
}